

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O2

int __thiscall
beagle::cpu::BeagleCPUImpl<float,_1,_0>::setCategoryWeights
          (BeagleCPUImpl<float,_1,_0> *this,int categoryWeightsIndex,double *inCategoryWeights)

{
  uint length;
  float **ppfVar1;
  int iVar2;
  float *pfVar3;
  
  iVar2 = -5;
  if ((-1 < categoryWeightsIndex) && (categoryWeightsIndex < this->kEigenDecompCount)) {
    ppfVar1 = this->gCategoryWeights;
    length = this->kCategoryCount;
    pfVar3 = ppfVar1[(uint)categoryWeightsIndex];
    if (pfVar3 == (float *)0x0) {
      pfVar3 = (float *)malloc((long)(int)length * 4);
      ppfVar1[(uint)categoryWeightsIndex] = pfVar3;
      pfVar3 = this->gCategoryWeights[(uint)categoryWeightsIndex];
      if (pfVar3 == (float *)0x0) {
        return -2;
      }
    }
    beagleMemCpy<float,double_const>(pfVar3,inCategoryWeights,length);
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

BEAGLE_CPU_TEMPLATE
int BeagleCPUImpl<BEAGLE_CPU_GENERIC>::setCategoryWeights(int categoryWeightsIndex,
                                                 const double* inCategoryWeights) {
    if (categoryWeightsIndex < 0 || categoryWeightsIndex >= kEigenDecompCount)
        return BEAGLE_ERROR_OUT_OF_RANGE;
    if (gCategoryWeights[categoryWeightsIndex] == NULL) {
        gCategoryWeights[categoryWeightsIndex] = (REALTYPE*) malloc(sizeof(REALTYPE) * kCategoryCount);
        if (gCategoryWeights[categoryWeightsIndex] == 0L)
            return BEAGLE_ERROR_OUT_OF_MEMORY;
    }
    beagleMemCpy(gCategoryWeights[categoryWeightsIndex], inCategoryWeights, kCategoryCount);

    return BEAGLE_SUCCESS;
}